

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority)

{
  short *psVar1;
  XMLCh theChar;
  bool bVar2;
  int iVar3;
  long lVar4;
  
  if (authority == (XMLCh *)0x0) {
    return false;
  }
  theChar = *authority;
  do {
    if (theChar == L'\0') {
      return theChar == L'\0';
    }
    bVar2 = XMLString::isAlphaNum(theChar);
    lVar4 = 2;
    if (((!bVar2) && (iVar3 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar3 == -1)) &&
       (iVar3 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,*authority), iVar3 == -1)) {
      if (*authority != L'%') {
        return false;
      }
      lVar4 = 0;
      do {
        psVar1 = (short *)((long)authority + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      if (0xfffffffffffffffc < (lVar4 >> 1) - 4U) {
        return false;
      }
      bVar2 = XMLString::isHex(authority[1]);
      if (!bVar2) {
        return false;
      }
      bVar2 = XMLString::isHex(authority[2]);
      lVar4 = 6;
      if (!bVar2) {
        return false;
      }
    }
    theChar = *(XMLCh *)((long)authority + lVar4);
    authority = (XMLCh *)((long)authority + lVar4);
  } while( true );
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority)
{
    // check authority
    if (!authority)
        return false;

    const XMLCh* tmpStr = authority;
    while (*tmpStr)
    {
        if (isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr + 1))     // 1st hex
                && XMLString::isHex(*(tmpStr + 2)))  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}